

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O3

void __thiscall FParser::SF_ScriptWaitPre(FParser *this)

{
  int iVar1;
  DRunningScript *pDVar2;
  undefined4 *puVar3;
  
  if (this->t_argc != 1) {
    script_error("insufficient arguments to function\n");
    return;
  }
  pDVar2 = SaveCurrentScript(this);
  pDVar2->wait_type = 4;
  iVar1 = intvalue(this->t_argv);
  pDVar2->wait_data = iVar1;
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 0;
  __cxa_throw(puVar3,&CFsTerminator::typeinfo,0);
}

Assistant:

void FParser::SF_ScriptWaitPre()
{
	DRunningScript *runscr;
	
	if(t_argc != 1)
	{
		script_error("insufficient arguments to function\n");
		return;
	}
	
	runscr = SaveCurrentScript();
	runscr->wait_type = wt_scriptwaitpre;
	runscr->wait_data = intvalue(t_argv[0]);
	throw CFsTerminator();
}